

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void compact_upto_overwrite_test(int opt)

{
  fdb_seqnum_t seqnum;
  fdb_status fVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  long extraout_RDX;
  uint uVar6;
  fdb_kvs_handle *pfVar7;
  fdb_kvs_handle *pfVar8;
  char *unaff_RBP;
  ulong uVar9;
  char *pcVar10;
  fdb_kvs_handle **ptr_handle;
  fdb_kvs_handle *pfVar11;
  fdb_file_handle *fhandle;
  btree *unaff_R12;
  long lVar12;
  btree *unaff_R13;
  ulong uVar13;
  uint uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  fdb_iterator *fit;
  fdb_doc *doc;
  fdb_file_handle *db_file;
  fdb_kvs_handle *db;
  uint64_t n_markers;
  fdb_snapshot_info_t *markers;
  fdb_kvs_handle *snap;
  char cmd [256];
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  char key [256];
  fdb_file_handle *pfStackY_d10;
  timeval tStackY_d08;
  fdb_config fStackY_cf8;
  code *pcStackY_c00;
  fdb_snapshot_info_t *pfStackY_bf8;
  ulong uStackY_bf0;
  fdb_kvs_handle *pfStackY_be8;
  fdb_kvs_handle *pfStackY_be0;
  fdb_kvs_config fStackY_bd8;
  timeval tStackY_bc0;
  char *pcStackY_bb0;
  char *pcStackY_ba8;
  fdb_kvs_handle *pfStackY_ba0;
  char *pcStackY_b98;
  char *pcStackY_b90;
  code *pcStackY_b88;
  fdb_file_handle *pfStackY_b78;
  int iStackY_b6c;
  fdb_kvs_handle *pfStackY_b68;
  fdb_kvs_handle *pfStackY_b60;
  fdb_kvs_handle *pfStackY_b58;
  fdb_kvs_handle *pfStackY_b50;
  fdb_kvs_handle *pfStackY_b48;
  undefined8 uStackY_b40;
  undefined8 uStackY_b38;
  undefined8 uStackY_b30;
  timeval tStackY_b20;
  fdb_kvs_config fStackY_b10;
  fdb_config fStackY_af8;
  char acStackY_a00 [256];
  char acStackY_900 [272];
  char *pcStackY_7f0;
  fdb_kvs_handle *pfStackY_7e8;
  char *pcStackY_7d8;
  code *pcStackY_7d0;
  fdb_snapshot_info_t *pfStackY_7c0;
  fdb_kvs_handle *pfStackY_7b8;
  uint64_t uStackY_7b0;
  timeval tStackY_7a8;
  size_t sStackY_798;
  fdb_kvs_handle **ppfStackY_790;
  code *pcStackY_788;
  fdb_kvs_handle *pfStackY_780;
  fdb_kvs_handle *pfStackY_778;
  fdb_kvs_handle *pfStackY_770;
  fdb_kvs_handle *pfStackY_768;
  undefined8 uStackY_760;
  undefined8 uStackY_758;
  fdb_kvs_handle *pfStackY_750;
  timeval tStackY_740;
  fdb_kvs_config fStackY_730;
  fdb_config fStackY_718;
  char acStackY_620 [256];
  fdb_kvs_handle *apfStackY_520 [33];
  fdb_kvs_handle *pfStackY_418;
  btree *pbStackY_410;
  btree *pbStackY_408;
  char *pcStackY_400;
  fdb_kvs_handle *pfStackY_3f8;
  fdb_kvs_handle *pfStackY_3f0;
  fdb_iterator *local_3d8;
  uint local_3cc;
  fdb_kvs_handle *local_3c8;
  fdb_file_handle *local_3c0;
  fdb_kvs_handle *local_3b8;
  char *local_3b0;
  int local_3a8;
  undefined4 uStack_3a4;
  fdb_snapshot_info_t *local_3a0;
  fdb_kvs_handle *local_398;
  fdb_kvs_handle *local_390;
  long local_388;
  fdb_kvs_config local_380;
  char local_368 [256];
  timeval local_268;
  undefined1 local_258 [304];
  fdb_custom_cmp_variable local_120;
  undefined1 local_110;
  undefined2 local_108;
  undefined1 local_e8;
  uint64_t local_70;
  
  pfVar11 = (fdb_kvs_handle *)0x0;
  pfStackY_3f0 = (fdb_kvs_handle *)0x112a10;
  local_3cc = opt;
  gettimeofday(&local_268,(__timezone_ptr_t)0x0);
  builtin_strncpy(local_368,"rm -rf  compact_test* > errorlog.txt",0x25);
  pfStackY_3f0 = (fdb_kvs_handle *)0x112a40;
  system(local_368);
  pfStackY_3f0 = (fdb_kvs_handle *)0x112a45;
  memleak_start();
  pfStackY_3f0 = (fdb_kvs_handle *)0x112a4f;
  pcVar3 = (char *)malloc(0x20);
  pfVar7 = (fdb_kvs_handle *)&stack0xfffffffffffffed8;
  pfStackY_3f0 = (fdb_kvs_handle *)0x112a62;
  fdb_get_default_config();
  local_108 = 0x201;
  local_110 = 1;
  local_e8 = 1;
  local_120 = (fdb_custom_cmp_variable)0x0;
  local_70 = 0;
  pfStackY_3f0 = (fdb_kvs_handle *)0x112a85;
  fdb_get_default_kvs_config();
  pfStackY_3f0 = (fdb_kvs_handle *)0x112a99;
  fVar1 = fdb_open(&local_3c0,"./compact_test",(fdb_config *)pfVar7);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130a7;
  pfStackY_3f0 = (fdb_kvs_handle *)0x112abc;
  fVar1 = fdb_kvs_open(local_3c0,&local_3b8,"db",&local_380);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130ac;
  unaff_RBP = (char *)CONCAT71((int7)((ulong)unaff_RBP >> 8),local_3cc == 0);
  local_3b0 = pcVar3 + 0x1a;
  unaff_R12 = (btree *)(local_258 + 0x30);
  unaff_R13 = (btree *)local_258;
  pfVar11 = (fdb_kvs_handle *)0x0;
  do {
    uVar14 = (uint)pfVar11;
    uVar6 = uVar14 + (int)((ulong)pfVar11 / 5) * -5;
    pfStackY_3f0 = (fdb_kvs_handle *)0x112b17;
    sprintf((char *)unaff_R12,"key%06d",(ulong)uVar6);
    builtin_strncpy(pcVar3,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
    builtin_strncpy(local_3b0,"<end>",6);
    pcVar10 = "updated_value%08d";
    if (uVar14 < 5) {
      pcVar10 = "value%08d";
    }
    pfStackY_3f0 = (fdb_kvs_handle *)0x112b5a;
    sprintf(pcVar3,pcVar10,(ulong)uVar6);
    pfVar7 = local_3b8;
    pfStackY_3f0 = (fdb_kvs_handle *)0x112b67;
    sVar4 = strlen((char *)unaff_R12);
    pfStackY_3f0 = (fdb_kvs_handle *)0x112b7f;
    fVar1 = fdb_set_kv(pfVar7,unaff_R12,sVar4 + 1,pcVar3,0x20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011305f;
    pfVar8 = pfVar11;
    if (local_3cc == 3) {
LAB_00112ba0:
      unaff_RBP = (char *)((ulong)pfVar8 & 0xffffffffffffff01);
    }
    else if (local_3cc == 2) {
      pfVar8 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)pfVar11 >> 8),~(byte)pfVar11);
      goto LAB_00112ba0;
    }
    pfStackY_3f0 = (fdb_kvs_handle *)0x112bb2;
    fVar1 = fdb_commit(local_3c0,(fdb_commit_opt_t)unaff_RBP);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113064;
    pfStackY_3f0 = (fdb_kvs_handle *)0x112bc7;
    fVar1 = fdb_get_kvs_info(local_3b8,(fdb_kvs_info *)unaff_R13);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113069;
    pfVar11 = (fdb_kvs_handle *)(ulong)(uVar14 + 1);
  } while (uVar14 + 1 != 10);
  pfStackY_3f0 = (fdb_kvs_handle *)0x112bf0;
  fVar1 = fdb_get_all_snap_markers(local_3c0,&local_3a0,(uint64_t *)&local_3a8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130b1;
  pfVar7 = (fdb_kvs_handle *)(CONCAT44(uStack_3a4,local_3a8) >> 1);
  iVar2 = (int)pfVar7;
  pfStackY_3f0 = (fdb_kvs_handle *)0x112c21;
  fVar1 = fdb_compact_upto(local_3c0,"./compact_test2",local_3a0[iVar2].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130b6;
  if (-1 < (int)(local_3a8 - 1U)) {
    pfVar7 = (fdb_kvs_handle *)(ulong)(local_3a8 - 1U);
    local_388 = (long)iVar2;
    unaff_R12 = (btree *)(local_258 + 0x30);
    do {
      pfVar11 = (fdb_kvs_handle *)(local_3a0[(long)pfVar7].kvs_markers)->seqnum;
      pfStackY_3f0 = (fdb_kvs_handle *)0x112c6e;
      fVar1 = fdb_snapshot_open(local_3b8,&local_398,(fdb_seqnum_t)pfVar11);
      if (local_388 < (long)pfVar7) {
        pfVar8 = pfVar7;
        if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113089;
      }
      else {
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011308e;
        pfStackY_3f0 = (fdb_kvs_handle *)0x112caf;
        local_390 = pfVar7;
        fVar1 = fdb_iterator_init(local_398,&local_3d8,(void *)0x0,0,(void *)0x0,0,0);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113093;
        pfVar11 = (fdb_kvs_handle *)((long)&pfVar11[-1].bub_ctx.handle + 3);
        pfVar7 = (fdb_kvs_handle *)0x0;
        do {
          local_3c8 = (fdb_kvs_handle *)0x0;
          pfStackY_3f0 = (fdb_kvs_handle *)0x112cd5;
          fVar1 = fdb_iterator_get(local_3d8,(fdb_doc **)&local_3c8);
          if (fVar1 != FDB_RESULT_SUCCESS) break;
          pfStackY_3f0 = (fdb_kvs_handle *)0x112cf0;
          sprintf((char *)unaff_R12,"key%06d",(ulong)pfVar7 & 0xffffffff);
          builtin_strncpy(pcVar3,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
          builtin_strncpy(local_3b0,"<end>",6);
          pcVar10 = "value%08d";
          if (pfVar7 < pfVar11) {
            pcVar10 = "updated_value%08d";
          }
          pfStackY_3f0 = (fdb_kvs_handle *)0x112d32;
          sprintf(pcVar3,pcVar10,(ulong)pfVar7 & 0xffffffff);
          unaff_RBP = (char *)local_3c8;
          unaff_R13 = (btree *)local_3c8->op_stats;
          pfStackY_3f0 = (fdb_kvs_handle *)0x112d4a;
          iVar2 = bcmp(unaff_R13,unaff_R12,*(size_t *)&local_3c8->kvs_config);
          if (iVar2 != 0) {
            pfStackY_3f0 = (fdb_kvs_handle *)0x113054;
            compact_upto_overwrite_test();
LAB_00113054:
            pfStackY_3f0 = (fdb_kvs_handle *)0x11305f;
            compact_upto_overwrite_test();
            goto LAB_0011305f;
          }
          unaff_R13 = (((fdb_kvs_handle *)unaff_RBP)->field_6).seqtree;
          pfStackY_3f0 = (fdb_kvs_handle *)0x112d65;
          iVar2 = bcmp(unaff_R13,pcVar3,
                       (size_t)(((fdb_kvs_handle *)unaff_RBP)->kvs_config).custom_cmp_param);
          if (iVar2 != 0) goto LAB_00113054;
          pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
          pfStackY_3f0 = (fdb_kvs_handle *)0x112d78;
          fdb_doc_free((fdb_doc *)unaff_RBP);
          pfStackY_3f0 = (fdb_kvs_handle *)0x112d82;
          fVar1 = fdb_iterator_next(local_3d8);
        } while (fVar1 == FDB_RESULT_SUCCESS);
        pfStackY_3f0 = (fdb_kvs_handle *)0x112d94;
        fVar1 = fdb_iterator_close(local_3d8);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113098;
        if ((int)pfVar7 != 5) goto LAB_001130a2;
        pfStackY_3f0 = (fdb_kvs_handle *)0x112daf;
        fVar1 = fdb_kvs_close(local_398);
        pfVar7 = local_390;
        pfVar8 = local_390;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011309d;
      }
      pfVar7 = (fdb_kvs_handle *)((long)&pfVar8[-1].bub_ctx.handle + 7);
    } while (0 < (long)pfVar8);
  }
  unaff_R12 = (btree *)(local_258 + 0x30);
  pfStackY_3f0 = (fdb_kvs_handle *)0x112dec;
  fVar1 = fdb_iterator_init(local_3b8,&local_3d8,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130bb;
  unaff_R13 = (btree *)(local_258 + 0x30);
  unaff_RBP = "updated_value%08d";
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    local_3c8 = (fdb_kvs_handle *)0x0;
    pfStackY_3f0 = (fdb_kvs_handle *)0x112e1d;
    fVar1 = fdb_iterator_get(local_3d8,(fdb_doc **)&local_3c8);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pfStackY_3f0 = (fdb_kvs_handle *)0x112e38;
    sprintf((char *)unaff_R13,"key%06d",pfVar7);
    builtin_strncpy(pcVar3,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
    builtin_strncpy(local_3b0,"<end>",6);
    pfStackY_3f0 = (fdb_kvs_handle *)0x112e68;
    sprintf(pcVar3,"updated_value%08d",pfVar7);
    pfVar11 = local_3c8;
    unaff_R12 = (btree *)local_3c8->op_stats;
    pfStackY_3f0 = (fdb_kvs_handle *)0x112e7f;
    iVar2 = bcmp(unaff_R12,unaff_R13,*(size_t *)&local_3c8->kvs_config);
    if (iVar2 != 0) goto LAB_0011306e;
    unaff_R12 = (pfVar11->field_6).seqtree;
    pfStackY_3f0 = (fdb_kvs_handle *)0x112e9a;
    iVar2 = bcmp(unaff_R12,pcVar3,(size_t)(pfVar11->kvs_config).custom_cmp_param);
    if (iVar2 != 0) goto LAB_0011307e;
    pfVar7 = (fdb_kvs_handle *)(ulong)((int)pfVar7 + 1);
    pfStackY_3f0 = (fdb_kvs_handle *)0x112eac;
    fdb_doc_free((fdb_doc *)pfVar11);
    pfStackY_3f0 = (fdb_kvs_handle *)0x112eb6;
    fVar1 = fdb_iterator_next(local_3d8);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pfStackY_3f0 = (fdb_kvs_handle *)0x112ec8;
  fVar1 = fdb_iterator_close(local_3d8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130c0;
  if ((int)pfVar7 != 5) goto LAB_001130c5;
  pfStackY_3f0 = (fdb_kvs_handle *)0x112ee8;
  fVar1 = fdb_free_snap_markers(local_3a0,CONCAT44(uStack_3a4,local_3a8));
  uVar6 = local_3cc;
  pfVar7 = (fdb_kvs_handle *)(ulong)local_3cc;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130ca;
  pfStackY_3f0 = (fdb_kvs_handle *)0x112efc;
  free(pcVar3);
  pfStackY_3f0 = (fdb_kvs_handle *)0x112f06;
  fVar1 = fdb_close(local_3c0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130cf;
  pfStackY_3f0 = (fdb_kvs_handle *)0x112f13;
  fVar1 = fdb_shutdown();
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130d4;
  pfStackY_3f0 = (fdb_kvs_handle *)0x112f20;
  memleak_end();
  builtin_strncpy(local_368 + 0x10,"rwrite test",0xc);
  builtin_strncpy(local_368,"compact upto ove",0x10);
  switch(uVar6) {
  case 0:
    pfStackY_3f0 = (fdb_kvs_handle *)0x112f66;
    sVar4 = strlen(local_368);
    builtin_strncpy(local_368 + sVar4," (HB+trie)",0xb);
    break;
  case 1:
    pfStackY_3f0 = (fdb_kvs_handle *)0x112fea;
    sVar4 = strlen(local_368);
    builtin_strncpy(local_368 + sVar4," (WAL)",7);
    break;
  case 2:
    pfStackY_3f0 = (fdb_kvs_handle *)0x112f92;
    sVar4 = strlen(local_368);
    builtin_strncpy(local_368 + sVar4 + 0xe,"ie/WAL)",8);
    uVar15._0_1_ = ' ';
    uVar15._1_1_ = 'H';
    uVar15._2_1_ = 'B';
    uVar15._3_1_ = '+';
    uVar16._0_1_ = 't';
    uVar16._1_1_ = 'r';
    uVar16._2_1_ = 'i';
    uVar16._3_1_ = 'e';
    goto LAB_00112fd3;
  case 3:
    pfStackY_3f0 = (fdb_kvs_handle *)0x112fba;
    sVar4 = strlen(local_368);
    builtin_strncpy(local_368 + sVar4 + 0xe,"B+trie)",8);
    uVar15._0_1_ = ' ';
    uVar15._1_1_ = 'W';
    uVar15._2_1_ = 'A';
    uVar15._3_1_ = 'L';
    uVar16._0_1_ = '/';
    uVar16._1_1_ = 'H';
    uVar16._2_1_ = 'B';
    uVar16._3_1_ = '+';
LAB_00112fd3:
    pcVar3 = local_368 + sVar4;
    pcVar3[0] = ' ';
    pcVar3[1] = '(';
    pcVar3[2] = 'm';
    pcVar3[3] = 'i';
    pcVar3 = local_368 + sVar4 + 4;
    pcVar3[0] = 'x';
    pcVar3[1] = 'e';
    pcVar3[2] = 'd';
    pcVar3[3] = ',';
    *(undefined4 *)(local_368 + sVar4 + 8) = uVar15;
    *(undefined4 *)(local_368 + sVar4 + 0xc) = uVar16;
  }
  pcVar3 = "%s PASSED\n";
  if (compact_upto_overwrite_test(int)::__test_pass != '\0') {
    pcVar3 = "%s FAILED\n";
  }
  pfStackY_3f0 = (fdb_kvs_handle *)0x113032;
  fprintf(_stderr,pcVar3,local_368);
  return;
LAB_0011305f:
  pfStackY_3f0 = (fdb_kvs_handle *)0x113064;
  compact_upto_overwrite_test();
LAB_00113064:
  pfStackY_3f0 = (fdb_kvs_handle *)0x113069;
  compact_upto_overwrite_test();
LAB_00113069:
  unaff_R12 = (btree *)(local_258 + 0x30);
  pfStackY_3f0 = (fdb_kvs_handle *)0x11306e;
  compact_upto_overwrite_test();
LAB_0011306e:
  pfStackY_3f0 = (fdb_kvs_handle *)0x11307e;
  compact_upto_overwrite_test();
LAB_0011307e:
  pfStackY_3f0 = (fdb_kvs_handle *)0x113089;
  compact_upto_overwrite_test();
LAB_00113089:
  pfStackY_3f0 = (fdb_kvs_handle *)0x11308e;
  compact_upto_overwrite_test();
LAB_0011308e:
  pfStackY_3f0 = (fdb_kvs_handle *)0x113093;
  compact_upto_overwrite_test();
LAB_00113093:
  pfStackY_3f0 = (fdb_kvs_handle *)0x113098;
  compact_upto_overwrite_test();
LAB_00113098:
  pfStackY_3f0 = (fdb_kvs_handle *)0x11309d;
  compact_upto_overwrite_test();
LAB_0011309d:
  pfStackY_3f0 = (fdb_kvs_handle *)0x1130a2;
  compact_upto_overwrite_test();
LAB_001130a2:
  pfStackY_3f0 = (fdb_kvs_handle *)0x1130a7;
  compact_upto_overwrite_test();
LAB_001130a7:
  pfStackY_3f0 = (fdb_kvs_handle *)0x1130ac;
  compact_upto_overwrite_test();
LAB_001130ac:
  pfStackY_3f0 = (fdb_kvs_handle *)0x1130b1;
  compact_upto_overwrite_test();
LAB_001130b1:
  pfStackY_3f0 = (fdb_kvs_handle *)0x1130b6;
  compact_upto_overwrite_test();
LAB_001130b6:
  pfStackY_3f0 = (fdb_kvs_handle *)0x1130bb;
  compact_upto_overwrite_test();
LAB_001130bb:
  pfStackY_3f0 = (fdb_kvs_handle *)0x1130c0;
  compact_upto_overwrite_test();
LAB_001130c0:
  pfStackY_3f0 = (fdb_kvs_handle *)0x1130c5;
  compact_upto_overwrite_test();
LAB_001130c5:
  pfStackY_3f0 = (fdb_kvs_handle *)0x1130ca;
  compact_upto_overwrite_test();
LAB_001130ca:
  pfStackY_3f0 = (fdb_kvs_handle *)0x1130cf;
  compact_upto_overwrite_test();
LAB_001130cf:
  pfStackY_3f0 = (fdb_kvs_handle *)0x1130d4;
  compact_upto_overwrite_test();
LAB_001130d4:
  pfStackY_3f0 = (fdb_kvs_handle *)compact_with_snapshot_open_test;
  compact_upto_overwrite_test();
  pcStackY_788 = (code *)0x1130f6;
  pfStackY_418 = pfVar7;
  pbStackY_410 = unaff_R12;
  pbStackY_408 = unaff_R13;
  pcStackY_400 = pcVar3;
  pfStackY_3f8 = pfVar11;
  pfStackY_3f0 = (fdb_kvs_handle *)unaff_RBP;
  gettimeofday(&tStackY_740,(__timezone_ptr_t)0x0);
  pcStackY_788 = (code *)0x1130fb;
  memleak_start();
  pcStackY_788 = (code *)0x113108;
  fdb_get_default_config();
  pcStackY_788 = (code *)0x113115;
  fdb_get_default_kvs_config();
  fStackY_718.compaction_cb_ctx = &uStackY_760;
  uStackY_760 = 0;
  uStackY_758 = 0;
  pfStackY_750 = (fdb_kvs_handle *)0x0;
  fStackY_718.wal_threshold = 0x400;
  fStackY_718.flags = 1;
  fStackY_718.compaction_cb = compaction_cb_get;
  fStackY_718.compaction_cb_mask = 0x1b;
  pcStackY_788 = (code *)0x11315b;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStackY_788 = (code *)0x113170;
  fdb_open((fdb_file_handle **)&pfStackY_780,"./compact_test1",&fStackY_718);
  pcStackY_788 = (code *)0x11318a;
  fdb_kvs_open((fdb_file_handle *)pfStackY_780,&pfStackY_768,"db",&fStackY_730);
  pcStackY_788 = (code *)0x11319d;
  fdb_kvs_open((fdb_file_handle *)pfStackY_780,&pfStackY_778,"db",&fStackY_730);
  uVar9 = 0;
  do {
    pcStackY_788 = (code *)0x1131c9;
    sprintf((char *)apfStackY_520,"key%04d",uVar9);
    pcStackY_788 = (code *)0x1131d8;
    sprintf(acStackY_620,"body%04d",uVar9);
    pfVar7 = pfStackY_768;
    pcStackY_788 = (code *)0x1131e5;
    sVar4 = strlen((char *)apfStackY_520);
    pcStackY_788 = (code *)0x1131f0;
    sVar5 = strlen(acStackY_620);
    pcStackY_788 = (code *)0x113204;
    ptr_handle = apfStackY_520;
    pfVar11 = pfVar7;
    fVar1 = fdb_set_kv(pfVar7,apfStackY_520,sVar4,acStackY_620,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStackY_788 = (code *)0x1132c9;
      compact_with_snapshot_open_test();
      goto LAB_001132c9;
    }
    uVar6 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar6;
  } while (uVar6 != 100000);
  ptr_handle = (fdb_kvs_handle **)0x1;
  pcStackY_788 = (code *)0x113224;
  pfVar11 = pfStackY_780;
  fVar1 = fdb_commit((fdb_file_handle *)pfStackY_780,'\x01');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStackY_750 = pfStackY_778;
    ptr_handle = (fdb_kvs_handle **)0x0;
    pcStackY_788 = (code *)0x113241;
    pfVar11 = pfStackY_780;
    fVar1 = fdb_compact((fdb_file_handle *)pfStackY_780,(char *)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132ce;
    ptr_handle = &pfStackY_770;
    pcStackY_788 = (code *)0x11325d;
    pfVar11 = pfStackY_778;
    fVar1 = fdb_snapshot_open(pfStackY_778,ptr_handle,100000);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132d3;
    pcStackY_788 = (code *)0x11326b;
    fdb_kvs_close(pfStackY_770);
    pcStackY_788 = (code *)0x113274;
    fVar1 = fdb_close((fdb_file_handle *)pfStackY_780);
    pfVar11 = pfStackY_780;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132d8;
    pcStackY_788 = (code *)0x11327d;
    fVar1 = fdb_shutdown();
    pfVar11 = pfStackY_780;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcVar3 = "%s PASSED\n";
      if (compact_with_snapshot_open_test()::__test_pass != '\0') {
        pcVar3 = "%s FAILED\n";
      }
      pcStackY_788 = (code *)0x1132b2;
      fprintf(_stderr,pcVar3,"compact with snapshot_open test");
      return;
    }
  }
  else {
LAB_001132c9:
    pcStackY_788 = (code *)0x1132ce;
    compact_with_snapshot_open_test();
LAB_001132ce:
    pcStackY_788 = (code *)0x1132d3;
    compact_with_snapshot_open_test();
LAB_001132d3:
    pcStackY_788 = (code *)0x1132d8;
    compact_with_snapshot_open_test();
LAB_001132d8:
    pcStackY_788 = (code *)0x1132dd;
    compact_with_snapshot_open_test();
  }
  pcStackY_788 = compaction_cb_get;
  compact_with_snapshot_open_test();
  pcStackY_7d0 = (code *)0x1132fe;
  sStackY_798 = sVar4;
  ppfStackY_790 = apfStackY_520;
  pcStackY_788 = (code *)uVar9;
  gettimeofday(&tStackY_7a8,(__timezone_ptr_t)0x0);
  if ((int)ptr_handle == 2) {
    if (extraout_RDX == 0) {
      pcStackY_7d0 = (code *)0x11330d;
      compaction_cb_get();
      goto LAB_0011330d;
    }
  }
  else {
LAB_0011330d:
    if (extraout_RDX != 0) goto LAB_00113374;
  }
  pcStackY_7d0 = (code *)0x113324;
  fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)pfVar11,&pfStackY_7c0,&uStackY_7b0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStackY_7d0 = (code *)0x113348;
    fVar1 = fdb_snapshot_open((fdb_kvs_handle *)(pfStackY_778->kvs_config).custom_cmp_param,
                              &pfStackY_7b8,pfStackY_7c0->kvs_markers->seqnum);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011336a;
    pcStackY_7d0 = (code *)0x113356;
    fVar1 = fdb_kvs_close(pfStackY_7b8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      return;
    }
  }
  else {
    pcStackY_7d0 = (code *)0x11336a;
    compaction_cb_get();
LAB_0011336a:
    pcStackY_7d0 = (code *)0x11336f;
    compaction_cb_get();
  }
  pcStackY_7d0 = (code *)0x113374;
  compaction_cb_get();
LAB_00113374:
  pcStackY_7d0 = compact_with_snapshot_open_multi_kvs_test;
  compaction_cb_get();
  pcStackY_7d8 = "body%04d";
  pfStackY_7e8 = pfVar7;
  pcStackY_b88 = (code *)0x113396;
  pcStackY_7f0 = acStackY_620;
  pcStackY_7d0 = (code *)((ulong)ptr_handle & 0xffffffff);
  gettimeofday(&tStackY_b20,(__timezone_ptr_t)0x0);
  pcStackY_b88 = (code *)0x11339b;
  memleak_start();
  pcStackY_b88 = (code *)0x1133ab;
  fdb_get_default_config();
  pcStackY_b88 = (code *)0x1133b8;
  fdb_get_default_kvs_config();
  fStackY_af8.compaction_cb_ctx = &uStackY_b40;
  uStackY_b40 = 0;
  uStackY_b38 = 0;
  uStackY_b30 = 0;
  fStackY_af8.wal_threshold = 0x400;
  fStackY_af8.flags = 1;
  fStackY_af8.compaction_cb = compaction_cb_markers;
  fStackY_af8.compaction_cb_mask = 0x1b;
  pcStackY_b88 = (code *)0x1133fe;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStackY_b88 = (code *)0x113415;
  fdb_open(&pfStackY_b78,"./compact_test1",&fStackY_af8);
  pcStackY_b88 = (code *)0x11342c;
  fdb_kvs_open(pfStackY_b78,&pfStackY_b48,"db1",&fStackY_b10);
  pcStackY_b88 = (code *)0x113443;
  fdb_kvs_open(pfStackY_b78,&pfStackY_b50,"db2",&fStackY_b10);
  pcStackY_b88 = (code *)0x11345a;
  fdb_kvs_open(pfStackY_b78,&pfStackY_b58,"db3",&fStackY_b10);
  pcStackY_b88 = (code *)0x113471;
  fdb_kvs_open(pfStackY_b78,&pfStackY_b60,"db4",&fStackY_b10);
  pcStackY_b88 = (code *)0x113488;
  fdb_kvs_open(pfStackY_b78,&pfStackY_b68,"db5",&fStackY_b10);
  uVar9 = 0;
  do {
    iVar2 = (int)uVar9;
    if (iVar2 == 5) goto LAB_0011360c;
    uVar9 = 0;
    iStackY_b6c = iVar2;
    do {
      pcStackY_b88 = (code *)0x1134c6;
      sprintf(acStackY_900,"key%04d",uVar9);
      pcStackY_b88 = (code *)0x1134d5;
      sprintf(acStackY_a00,"body%04d",uVar9);
      pfVar7 = pfStackY_b48;
      pcStackY_b88 = (code *)0x1134e2;
      sVar4 = strlen(acStackY_900);
      pcStackY_b88 = (code *)0x1134f0;
      sVar5 = strlen(acStackY_a00);
      pcStackY_b88 = (code *)0x113504;
      fdb_set_kv(pfVar7,acStackY_900,sVar4,acStackY_a00,sVar5);
      pfVar7 = pfStackY_b50;
      pcStackY_b88 = (code *)0x113511;
      sVar4 = strlen(acStackY_900);
      pcStackY_b88 = (code *)0x11351c;
      sVar5 = strlen(acStackY_a00);
      pcStackY_b88 = (code *)0x113530;
      fdb_set_kv(pfVar7,acStackY_900,sVar4,acStackY_a00,sVar5);
      pfVar7 = pfStackY_b58;
      pcStackY_b88 = (code *)0x11353d;
      sVar4 = strlen(acStackY_900);
      pcStackY_b88 = (code *)0x113548;
      sVar5 = strlen(acStackY_a00);
      pcStackY_b88 = (code *)0x11355c;
      fdb_set_kv(pfVar7,acStackY_900,sVar4,acStackY_a00,sVar5);
      pfVar7 = pfStackY_b60;
      pcStackY_b88 = (code *)0x113569;
      sVar4 = strlen(acStackY_900);
      pcStackY_b88 = (code *)0x113574;
      sVar5 = strlen(acStackY_a00);
      pcStackY_b88 = (code *)0x113588;
      fdb_set_kv(pfVar7,acStackY_900,sVar4,acStackY_a00,sVar5);
      pfVar11 = pfStackY_b68;
      pcStackY_b88 = (code *)0x113595;
      pfVar7 = (fdb_kvs_handle *)strlen(acStackY_900);
      pcStackY_b88 = (code *)0x1135a0;
      sVar4 = strlen(acStackY_a00);
      pcStackY_b88 = (code *)0x1135be;
      fdb_set_kv(pfVar11,acStackY_900,(size_t)pfVar7,acStackY_a00,sVar4);
      uVar6 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar6;
    } while (uVar6 != 1000);
    pcStackY_b88 = (code *)0x1135db;
    fhandle = pfStackY_b78;
    fVar1 = fdb_commit(pfStackY_b78,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStackY_b88 = (code *)0x11366b;
      compact_with_snapshot_open_multi_kvs_test();
      goto LAB_0011366b;
    }
    uVar9 = (ulong)(iStackY_b6c + 1U);
    uStackY_b40 = CONCAT44(uStackY_b40._4_4_,(iStackY_b6c + 1U) * 1000);
    pcStackY_b88 = (code *)0x1135ff;
    fVar1 = fdb_compact(pfStackY_b78,(char *)0x0);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pcStackY_b88 = (code *)0x11360c;
  compact_with_snapshot_open_multi_kvs_test();
LAB_0011360c:
  pcStackY_b88 = (code *)0x113616;
  fhandle = pfStackY_b78;
  fVar1 = fdb_close(pfStackY_b78);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStackY_b88 = (code *)0x11361f;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcVar3 = "%s PASSED\n";
      if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
        pcVar3 = "%s FAILED\n";
      }
      pcStackY_b88 = (code *)0x113654;
      fprintf(_stderr,pcVar3,"compact with snapshot_open multi kvs test");
      return;
    }
  }
  else {
LAB_0011366b:
    pcStackY_b88 = (code *)0x113670;
    compact_with_snapshot_open_multi_kvs_test();
  }
  pcStackY_b88 = compaction_cb_markers;
  compact_with_snapshot_open_multi_kvs_test();
  pcStackY_b90 = "body%04d";
  pcStackY_bb0 = "key%04d";
  pcStackY_c00 = (code *)0x11369a;
  pcStackY_ba8 = acStackY_a00;
  pfStackY_ba0 = pfVar7;
  pcStackY_b98 = acStackY_900;
  pcStackY_b88 = (code *)uVar9;
  gettimeofday(&tStackY_bc0,(__timezone_ptr_t)0x0);
  pcStackY_c00 = (code *)0x1136a4;
  fdb_get_default_kvs_config();
  iVar2 = *(int *)&pfStackY_b78->root;
  pcStackY_c00 = (code *)0x1136b7;
  fVar1 = fdb_get_all_snap_markers(fhandle,&pfStackY_bf8,&uStackY_bf0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    if (pfStackY_bf8->num_kvs_markers != 6) {
      pcStackY_c00 = (code *)0x113799;
      compaction_cb_markers();
    }
    seqnum = pfStackY_bf8->kvs_markers->seqnum;
    if (seqnum == (long)iVar2) {
      if (uStackY_bf0 != 0) {
        uVar9 = 0;
        do {
          if (pfStackY_bf8[uVar9].num_kvs_markers != 0) {
            lVar12 = 0;
            uVar13 = 0;
            do {
              pcVar3 = *(char **)((long)&(pfStackY_bf8[uVar9].kvs_markers)->kv_store_name + lVar12);
              if (pcVar3 != (char *)0x0) {
                pcStackY_c00 = (code *)0x11372e;
                fdb_kvs_open(fhandle,&pfStackY_be8,pcVar3,&fStackY_bd8);
                pcStackY_c00 = (code *)0x113740;
                fVar1 = fdb_snapshot_open(pfStackY_be8,&pfStackY_be0,seqnum);
                if (fVar1 == FDB_RESULT_SUCCESS) {
                  pcStackY_c00 = (code *)0x11374e;
                  fVar1 = fdb_kvs_close(pfStackY_be0);
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    pcStackY_c00 = (code *)0x1137a3;
                    compaction_cb_markers();
                    goto LAB_001137a3;
                  }
                  pcStackY_c00 = (code *)0x11375c;
                  fVar1 = fdb_kvs_close(pfStackY_be8);
                  if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113760;
                }
                else {
LAB_001137a3:
                  pcStackY_c00 = (code *)0x1137a8;
                  compaction_cb_markers();
                }
                pcStackY_c00 = (code *)0x1137ad;
                compaction_cb_markers();
                goto LAB_001137ad;
              }
LAB_00113760:
              uVar13 = uVar13 + 1;
              lVar12 = lVar12 + 0x10;
            } while (uVar13 < (ulong)pfStackY_bf8[uVar9].num_kvs_markers);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < uStackY_bf0);
      }
      return;
    }
  }
  else {
LAB_001137ad:
    pcStackY_c00 = (code *)0x1137b2;
    compaction_cb_markers();
  }
  pcStackY_c00 = db_compact_during_compaction_cancellation;
  compaction_cb_markers();
  gettimeofday(&tStackY_d08,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fStackY_cf8.compaction_cb = cb_cancel_test;
  fStackY_cf8.compaction_cb_ctx = (void *)0x0;
  fStackY_cf8.compaction_cb_mask = 0x11;
  fVar1 = fdb_open(&pfStackY_d10,"compact_test",&fStackY_cf8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcac);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
  }
  fVar1 = fdb_compact(pfStackY_d10,(char *)0x0);
  if (((uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
     ((0x200004000001U >> ((ulong)(uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
    fdb_close(pfStackY_d10);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0xcb1);
  __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
}

Assistant:

void compact_upto_overwrite_test(int opt)
{
    TEST_INIT();

    int n = 10, value_len=32;
    int i, r, idx, c;
    char cmd[256];
    char key[256], *value;
    char keystr[] = "key%06d";
    char valuestr[] = "value%08d";
    char valuestr2[] = "updated_value%08d";
    fdb_file_handle *db_file;
    fdb_kvs_handle *db, *snap;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s;
    fdb_kvs_info kvs_info;
    fdb_iterator *fit;
    fdb_doc *doc;
    fdb_snapshot_info_t *markers;
    fdb_seqnum_t seqnum;
    fdb_commit_opt_t commit_opt;
    uint64_t n_markers;

    sprintf(cmd, SHELL_DEL " compact_test* > errorlog.txt");
    r = system(cmd);
    (void)r;

    memleak_start();

    value = (char*)malloc(value_len);

    config = fdb_get_default_config();
    config.durability_opt = FDB_DRB_ASYNC;
    config.seqtree_opt = FDB_SEQTREE_USE;
    config.wal_flush_before_commit = true;
    config.multi_kv_instances = true;
    config.buffercache_size = 0;
    config.block_reusing_threshold = 0;

    commit_opt = (opt)?FDB_COMMIT_NORMAL:FDB_COMMIT_MANUAL_WAL_FLUSH;

    kvs_config = fdb_get_default_kvs_config();

    s = fdb_open(&db_file, "./compact_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // === write ===
    for (i=0;i<n;++i){
        idx = i % (n/2);
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        if (i < (n/2)) {
            sprintf(value, valuestr, idx);
        } else {
            sprintf(value, valuestr2, idx);
        }
        s = fdb_set_kv(db, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        if (opt == 2) {
            // HB+trie, WAL, HB+trie, WAL...
            commit_opt = (i%2)?FDB_COMMIT_NORMAL:FDB_COMMIT_MANUAL_WAL_FLUSH;
        } else if (opt == 3) {
            // WAL, HB+trie, WAL, HB+trie...
            commit_opt = (i%2)?FDB_COMMIT_MANUAL_WAL_FLUSH:FDB_COMMIT_NORMAL;
        }

        s = fdb_commit(db_file, commit_opt);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_get_all_snap_markers(db_file, &markers, &n_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    int upto = n_markers/2;
    s = fdb_compact_upto(db_file, "./compact_test2", markers[upto].marker);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // iterating using snapshots with various seqnums
    for (i=n_markers-1; i>=0; --i) {
        seqnum = markers[i].kvs_markers->seqnum;

        s = fdb_snapshot_open(db, &snap, seqnum);
        if (i<=upto) {
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        } else {
            // seqnum < (n/2) must fail
            TEST_CHK(s != FDB_RESULT_SUCCESS);
            continue;
        }

        s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        c = 0;
        do {
            doc = NULL;
            s = fdb_iterator_get(fit, &doc);
            if (s != FDB_RESULT_SUCCESS) break;
            idx = c;
            sprintf(key, keystr, idx);
            memset(value, 'x', value_len);
            memcpy(value + value_len - 6, "<end>", 6);
            if ((fdb_seqnum_t)c >= seqnum-(n/2)) {
                sprintf(value, valuestr, idx);
            } else {
                sprintf(value, valuestr2, idx);
            }
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CMP(doc->body, value, doc->bodylen);
            c++;
            fdb_doc_free(doc);
        } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
        s = fdb_iterator_close(fit);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CHK(c == (n/2));

        s = fdb_kvs_close(snap);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // iterating using the original handle
    s = fdb_iterator_init(db, &fit, NULL, 0, NULL, 0, 0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    c = 0;
    do {
        doc = NULL;
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) break;
        idx = c;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr2, idx);
        TEST_CMP(doc->key, key, doc->keylen);
        TEST_CMP(doc->body, value, doc->bodylen);
        c++;
        fdb_doc_free(doc);
    } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(c == (n/2));

    s = fdb_free_snap_markers(markers, n_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    free(value);
    s = fdb_close(db_file);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memleak_end();

    sprintf(cmd, "compact upto overwrite test");
    if (opt == 0) {
        strcat(cmd, " (HB+trie)");
    } else if (opt == 1) {
        strcat(cmd, " (WAL)");
    } else if (opt == 2) {
        strcat(cmd, " (mixed, HB+trie/WAL)");
    } else if (opt == 3) {
        strcat(cmd, " (mixed, WAL/HB+trie)");
    }
    TEST_RESULT(cmd);
}